

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4161a3::Db::parseDecltype(Db *this)

{
  bool bVar1;
  Node *local_20;
  Node *E;
  Db *this_local;
  
  E = (Node *)this;
  bVar1 = consumeIf(this,'D');
  if (bVar1) {
    bVar1 = consumeIf(this,'t');
    if ((!bVar1) && (bVar1 = consumeIf(this,'T'), !bVar1)) {
      return (Node *)0x0;
    }
    local_20 = parseExpr(this);
    if (local_20 == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      bVar1 = consumeIf(this,'E');
      if (bVar1) {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::EnclosingExpr,char_const(&)[10],(anonymous_namespace)::Node*&,char_const(&)[2]>
                                     ((Db *)this,(char (*) [10])"decltype(",&local_20,
                                      (char (*) [2])0x317991);
      }
      else {
        this_local = (Db *)0x0;
      }
    }
  }
  else {
    this_local = (Db *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseDecltype() {
  if (!consumeIf('D'))
    return nullptr;
  if (!consumeIf('t') && !consumeIf('T'))
    return nullptr;
  Node *E = parseExpr();
  if (E == nullptr)
    return nullptr;
  if (!consumeIf('E'))
    return nullptr;
  return make<EnclosingExpr>("decltype(", E, ")");
}